

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitCommonExpr(EExpr *__return_storage_ptr__,
                 ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,Reference r)

{
  vector<int,_std::allocator<int>_> *this_00;
  ExprBase e;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer piVar4;
  size_t index_1;
  ulong uVar5;
  bool bVar6;
  int index;
  LinTerms local_428;
  EExpr eexpr;
  AlgebraicExpression<mp::QuadAndLinTerms> local_1f0;
  long lVar3;
  
  iVar2 = *(int *)((long)r.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                         impl_ + 4);
  uVar5 = (ulong)iVar2;
  iVar1 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])(this);
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->dvelim_ == 2) {
    bVar6 = true;
  }
  else if (this->dvelim_ == 1) {
    bVar6 = *(int *)(*(long *)(lVar3 + 0x2e0) + uVar5 * 4) != 0;
  }
  else {
    bVar6 = false;
  }
  this_00 = &this->common_exprs_;
  piVar4 = (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2) <= iVar2)
  {
    iVar2 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (this_00,(long)(int)((*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x2b8) -
                                   *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x2b0)) / 0x78),
               (value_type *)&eexpr);
    piVar4 = (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->dvelim_ != 0) {
      std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::resize
                (&this->common_ee_,
                 (long)(this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
      piVar4 = (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  if (piVar4[uVar5] < 0) {
    ToLinTerms(&local_428,(LinearExpr *)(uVar5 * 0x78 + *(long *)(lVar3 + 0x2b0)));
    EExpr::EExpr(&eexpr,&local_428);
    LinTerms::~LinTerms(&local_428);
    if ((uVar5 < (ulong)(*(long *)(lVar3 + 0x2d0) - *(long *)(lVar3 + 0x2c8) >> 3)) &&
       (e.impl_ = ((ExprBase *)(*(long *)(lVar3 + 0x2c8) + uVar5 * 8))->impl_,
       e.impl_ != (Impl *)0x0)) {
      BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ::Visit((EExpr *)&local_1f0,
              (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
               *)this,(Expr)e.impl_);
      AlgebraicExpression<mp::QuadAndLinTerms>::add(&eexpr.super_QuadraticExpr,&local_1f0);
      QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
    }
    if (bVar6) {
      (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = 0;
      AlgebraicExpression<mp::QuadAndLinTerms>::operator=
                (&(this->common_ee_).super__Vector_base<mp::EExpr,_std::allocator<mp::EExpr>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5].super_QuadraticExpr,
                 &eexpr.super_QuadraticExpr);
    }
    else {
      iVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::Convert2Var((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             *)&this->flat_cvt_,&eexpr.super_QuadraticExpr);
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar5] = iVar2;
    }
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)&eexpr);
  }
  if (bVar6) {
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&__return_storage_ptr__->super_QuadraticExpr,
               &(this->common_ee_).super__Vector_base<mp::EExpr,_std::allocator<mp::EExpr>_>._M_impl
                .super__Vector_impl_data._M_start[uVar5].super_QuadraticExpr);
  }
  else {
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&__return_storage_ptr__->super_QuadraticExpr,
               (Variable)
               (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5]);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitCommonExpr(Reference r) {
    const auto index = r.index();
    auto ce = MP_DISPATCH( GetModel() ).common_expr(index);
    MP_ASSERT_ALWAYS(ce.is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    bool dvelim
        = 2==defvarelim()         // always inline
          || (1==defvarelim()
              && ce.position());  // used only 1x. @todo own ref count #153
    if (index >= (int)common_exprs_.size()) {
      assert(index < GetModel().num_common_exprs());
      common_exprs_.resize(
                  GetModel().num_common_exprs(),
                  -1);          // init by -1, "no variable"
      if (defvarelim())
        common_ee_.resize(common_exprs_.size());
    }
    if (common_exprs_[index]<0) {                 // not yet converted
      EExpr eexpr( ToLinTerms(ce.linear_expr()) );
      if (ce.nonlinear_expr())
        eexpr.add( Convert2EExpr(ce.nonlinear_expr()) );
      if (dvelim) {             // provide the eexpr itself
        common_exprs_[index] = 0;
        assert((int)common_ee_.size() > index);
        common_ee_[index] = std::move(eexpr);
      } else                            // convert 2 var
        common_exprs_[index] = Convert2Var(std::move(eexpr));
    }
    if (dvelim)
      return common_ee_[index];
    return EExpr::Variable{ common_exprs_[index] };
  }